

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O1

void accumulate(vector<double,_std::allocator<double>_> *output,
               vector<double,_std::allocator<double>_> *input)

{
  pointer pdVar1;
  pointer pdVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((ulong)((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start) < uVar4) {
    std::vector<double,_std::allocator<double>_>::resize(output,(long)uVar4 >> 3);
  }
  pdVar1 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    pdVar2 = (output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar2[lVar5] = pdVar1[lVar5] + pdVar2[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
  }
  return;
}

Assistant:

void
accumulate (vector<double>& output, const vector<double>& input)
{
    if (output.size () < input.size ()) { output.resize (input.size ()); }
    for (size_t x = 0; x < input.size (); ++x)
    {
        output[x] += input[x];
    }
}